

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O0

void ascon_hasha_xof(uint8_t *digest,uint8_t *data,size_t digest_len,size_t data_len)

{
  ascon_hash_ctx_t ctx;
  uint8_t *in_stack_ffffffffffffff98;
  ascon_hash_ctx_t *in_stack_ffffffffffffffa0;
  
  ascon_hasha_xof_init((ascon_hash_ctx_t *)0x1296b2);
  ascon_hasha_xof_update(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1296c6);
  ascon_hasha_xof_final(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1296da);
  return;
}

Assistant:

ASCON_API void
ascon_hasha_xof(uint8_t* const digest,
                const uint8_t* const data,
                const size_t digest_len,
                const size_t data_len)
{
    ASCON_ASSERT(digest_len == 0 || digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_xof_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    ascon_hasha_xof_final(&ctx, digest, digest_len);
}